

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_mp3_ds_seek(ma_data_source *pDataSource,ma_uint64 frameIndex)

{
  ma_bool32 mVar1;
  
  if (pDataSource != (ma_data_source *)0x0) {
    mVar1 = ma_dr_mp3_seek_to_pcm_frame((ma_dr_mp3 *)((long)pDataSource + 0x70),frameIndex);
    return -(uint)(mVar1 != 1);
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_mp3_seek_to_pcm_frame(ma_mp3* pMP3, ma_uint64 frameIndex)
{
    if (pMP3 == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_MP3)
    {
        ma_bool32 mp3Result;

        mp3Result = ma_dr_mp3_seek_to_pcm_frame(&pMP3->dr, frameIndex);
        if (mp3Result != MA_TRUE) {
            return MA_ERROR;
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* mp3 is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);

        (void)frameIndex;

        return MA_NOT_IMPLEMENTED;
    }
    #endif
}